

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeBuilder.cpp
# Opt level: O0

void __thiscall
OctreeBuilder::CmdTransferOctreeOwnership
          (OctreeBuilder *this,shared_ptr<myvk::CommandBuffer> *command_buffer,
          uint32_t src_queue_family,uint32_t dst_queue_family,VkPipelineStageFlags src_stage,
          VkPipelineStageFlags dst_stage)

{
  initializer_list<VkBufferMemoryBarrier> __l;
  element_type *this_00;
  BufferBase *in_RDI;
  VkAccessFlags in_R8D;
  VkAccessFlags in_R9D;
  allocator_type *in_stack_ffffffffffffff38;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *in_stack_ffffffffffffff40;
  iterator in_stack_ffffffffffffff48;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *in_stack_ffffffffffffff50;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *in_stack_ffffffffffffff58;
  vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *in_stack_ffffffffffffff60;
  VkPipelineStageFlags in_stack_ffffffffffffff68;
  VkPipelineStageFlags in_stack_ffffffffffffff6c;
  CommandBuffer *in_stack_ffffffffffffff70;
  
  this_00 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1580cf);
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x15810e);
  std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x15811f
            );
  myvk::BufferBase::GetMemoryBarrier
            (in_RDI,in_R9D,in_R8D,(uint32_t)((ulong)this_00 >> 0x20),(uint32_t)this_00);
  std::allocator<VkBufferMemoryBarrier>::allocator((allocator<VkBufferMemoryBarrier> *)0x15816a);
  __l._M_len = (size_type)in_stack_ffffffffffffff50;
  __l._M_array = in_stack_ffffffffffffff48;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            (in_stack_ffffffffffffff40,__l,in_stack_ffffffffffffff38);
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)0x1581ae);
  myvk::CommandBuffer::CmdPipelineBarrier
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)this_00);
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)this_00);
  std::allocator<VkBufferMemoryBarrier>::~allocator
            ((allocator<VkBufferMemoryBarrier> *)&stack0xffffffffffffff5b);
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)this_00);
  return;
}

Assistant:

void OctreeBuilder::CmdTransferOctreeOwnership(const std::shared_ptr<myvk::CommandBuffer> &command_buffer,
                                               uint32_t src_queue_family, uint32_t dst_queue_family,
                                               VkPipelineStageFlags src_stage, VkPipelineStageFlags dst_stage) const {
	command_buffer->CmdPipelineBarrier(
	    src_stage, dst_stage, {}, {m_octree_buffer->GetMemoryBarrier(0, 0, src_queue_family, dst_queue_family)}, {});
}